

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O2

void __thiscall
RasterizerA3<4u>::_renderImpl<CompositorSIMD,false>(RasterizerA3<4u> *this,uint32_t argb32)

{
  int *piVar1;
  char *pcVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint32_t uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint32_t *puVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  ulong *puVar27;
  ulong uVar28;
  long lVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  short sVar33;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 in_XMM1 [16];
  undefined1 auVar34 [16];
  short sVar41;
  int iVar42;
  int iVar59;
  undefined1 auVar44 [12];
  int iVar56;
  undefined1 in_XMM2 [16];
  undefined1 auVar45 [16];
  int iVar60;
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar43;
  undefined1 auVar54 [16];
  undefined1 in_XMM3 [16];
  short sVar61;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  undefined1 in_XMM6 [16];
  undefined1 auVar62 [16];
  short sVar69;
  undefined1 in_XMM8 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar71 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar78;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  undefined1 auVar79 [16];
  short sVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  short sVar89;
  short sVar90;
  short sVar94;
  short sVar95;
  short sVar97;
  int iVar96;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar102;
  int iVar101;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar48 [16];
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  ushort uVar55;
  ushort uVar57;
  short sVar58;
  
  lVar5 = *(long *)(*(long *)(this + 8) + 8);
  uVar18 = (ulong)*(int *)(this + 0x40);
  iVar4 = *(int *)(this + 0x44);
  puVar27 = (ulong *)(*(long *)(this + 0x48) * uVar18 * 8 + *(long *)(this + 0x50));
  lVar29 = *(long *)(this + 0x58) * uVar18 * 8 + *(long *)(this + 0x60);
  lVar30 = lVar5 * uVar18 + *(long *)(*(long *)(this + 8) + 0x10);
  uVar12 = PixelUtils::premultiply(argb32);
  auVar11 = _DAT_001181c0;
  auVar10 = _DAT_00118190;
  auVar32._4_4_ = uVar12;
  auVar32._0_4_ = uVar12;
  auVar32._8_4_ = uVar12;
  auVar32._12_4_ = uVar12;
  auVar34 = pmovzxbw(in_XMM1,auVar32);
  auVar62 = pmovzxbw(in_XMM6,0x8080808080808080);
  auVar70 = pmovsxwd(in_XMM8,0x1ff01ff01ff01ff);
  auVar71 = pmovzxbw(in_XMM9,0xffffffffffffffff);
  for (; uVar18 <= (ulong)(long)iVar4; uVar18 = uVar18 + 1) {
    lVar14 = *(long *)(this + 0x48);
    uVar26 = 0;
    uVar16 = 0;
    uVar15 = 0;
    do {
      uVar22 = *puVar27;
      *puVar27 = 0;
      uVar25 = uVar15 + 0x100;
      while( true ) {
        sVar33 = auVar34._0_2_;
        sVar35 = auVar34._2_2_;
        sVar36 = auVar34._4_2_;
        sVar37 = auVar34._6_2_;
        sVar38 = auVar34._8_2_;
        sVar39 = auVar34._10_2_;
        sVar40 = auVar34._12_2_;
        sVar41 = auVar34._14_2_;
        sVar61 = auVar62._0_2_;
        sVar63 = auVar62._2_2_;
        sVar64 = auVar62._4_2_;
        sVar65 = auVar62._6_2_;
        sVar66 = auVar62._8_2_;
        sVar67 = auVar62._10_2_;
        sVar68 = auVar62._12_2_;
        sVar69 = auVar62._14_2_;
        if (uVar22 == 0) break;
        lVar6 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
          }
        }
        uVar28 = -1L << ((byte)lVar6 & 0x3f);
        uVar20 = (uint)((int)lVar6 << 2) | uVar15;
        uVar21 = uVar16;
        if (uVar16 <= uVar20 && uVar20 - uVar16 != 0) {
          uVar17 = uVar26 & 0x1ff;
          uVar24 = uVar17 ^ 0x1ff;
          if (uVar17 < 0x100) {
            uVar24 = uVar17;
          }
          uVar21 = uVar20;
          if (uVar24 != 0) {
            uVar13 = uVar20 - uVar16 >> 2;
            if (uVar24 == 0xff) {
              puVar23 = (uint32_t *)(lVar30 + uVar16 * 4);
              for (; 7 < uVar13; uVar13 = uVar13 - 8) {
                *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x20 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x30 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x40 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x50 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x60 + uVar16 * 4) = auVar32;
                *(undefined1 (*) [16])(lVar30 + 0x70 + uVar16 * 4) = auVar32;
                uVar16 = uVar16 + 0x20;
                puVar23 = puVar23 + 0x20;
              }
              for (uVar19 = 0; uVar13 != uVar19; uVar19 = uVar19 + 1) {
                *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = auVar32;
                uVar16 = uVar16 + 4;
                puVar23 = puVar23 + 4;
              }
              for (; uVar16 < uVar20; uVar16 = uVar16 + 1) {
                *puVar23 = uVar12;
                puVar23 = puVar23 + 1;
              }
            }
            else {
              auVar105 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
              auVar79._0_4_ = auVar105._0_4_;
              auVar79._4_4_ = auVar79._0_4_;
              auVar79._8_4_ = auVar79._0_4_;
              auVar79._12_4_ = auVar79._0_4_;
              sVar89 = auVar105._0_2_;
              sVar58 = auVar105._2_2_;
              auVar79 = auVar79 ^ _DAT_00118170;
              sVar90 = sVar89 * sVar33 + 0x80;
              sVar94 = sVar58 * sVar35 + 0x80;
              sVar95 = sVar89 * sVar36 + 0x80;
              sVar97 = sVar58 * sVar37 + 0x80;
              sVar98 = sVar89 * sVar38 + 0x80;
              sVar99 = sVar58 * sVar39 + 0x80;
              sVar100 = sVar89 * sVar40 + 0x80;
              sVar102 = sVar58 * sVar41 + 0x80;
              while( true ) {
                sVar78 = auVar79._0_2_;
                sVar82 = auVar79._2_2_;
                sVar83 = auVar79._4_2_;
                sVar84 = auVar79._6_2_;
                sVar85 = auVar79._8_2_;
                sVar86 = auVar79._10_2_;
                sVar87 = auVar79._12_2_;
                sVar88 = auVar79._14_2_;
                if (uVar13 < 2) break;
                auVar105 = *(undefined1 (*) [16])(lVar30 + uVar16 * 4);
                auVar92 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4);
                auVar93 = pmovzxbw(in_XMM15,auVar105);
                auVar73 = pmovzxbw(in_XMM2,auVar92);
                auVar72._0_2_ = (ushort)auVar105[8] * sVar78 + sVar90;
                auVar72._2_2_ = (ushort)auVar105[9] * sVar82 + sVar94;
                auVar72._4_2_ = (ushort)auVar105[10] * sVar83 + sVar95;
                auVar72._6_2_ = (ushort)auVar105[0xb] * sVar84 + sVar97;
                auVar72._8_2_ = (ushort)auVar105[0xc] * sVar85 + sVar98;
                auVar72._10_2_ = (ushort)auVar105[0xd] * sVar86 + sVar99;
                auVar72._12_2_ = (ushort)auVar105[0xe] * sVar87 + sVar100;
                auVar72._14_2_ = (ushort)auVar105[0xf] * sVar88 + sVar102;
                in_XMM10 = pmulhuw(auVar72,auVar10);
                auVar103._0_2_ = (ushort)auVar92[8] * sVar78 + sVar90;
                auVar103._2_2_ = (ushort)auVar92[9] * sVar82 + sVar94;
                auVar103._4_2_ = (ushort)auVar92[10] * sVar83 + sVar95;
                auVar103._6_2_ = (ushort)auVar92[0xb] * sVar84 + sVar97;
                auVar103._8_2_ = (ushort)auVar92[0xc] * sVar85 + sVar98;
                auVar103._10_2_ = (ushort)auVar92[0xd] * sVar86 + sVar99;
                auVar103._12_2_ = (ushort)auVar92[0xe] * sVar87 + sVar100;
                auVar103._14_2_ = (ushort)auVar92[0xf] * sVar88 + sVar102;
                auVar92 = pmulhuw(auVar103,auVar10);
                auVar107._0_2_ = auVar93._0_2_ * sVar78 + sVar90;
                auVar107._2_2_ = auVar93._2_2_ * sVar82 + sVar94;
                auVar107._4_2_ = auVar93._4_2_ * sVar83 + sVar95;
                auVar107._6_2_ = auVar93._6_2_ * sVar84 + sVar97;
                auVar107._8_2_ = auVar93._8_2_ * sVar85 + sVar98;
                auVar107._10_2_ = auVar93._10_2_ * sVar86 + sVar99;
                auVar107._12_2_ = auVar93._12_2_ * sVar87 + sVar100;
                auVar107._14_2_ = auVar93._14_2_ * sVar88 + sVar102;
                auVar105 = pmulhuw(auVar107,auVar10);
                sVar7 = auVar105._0_2_;
                sVar8 = auVar105._2_2_;
                in_XMM15[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar105[2] - (0xff < sVar8);
                in_XMM15[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[0] - (0xff < sVar7);
                sVar7 = auVar105._4_2_;
                in_XMM15[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[4] - (0xff < sVar7);
                sVar7 = auVar105._6_2_;
                in_XMM15[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[6] - (0xff < sVar7);
                sVar7 = auVar105._8_2_;
                in_XMM15[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[8] - (0xff < sVar7);
                sVar7 = auVar105._10_2_;
                in_XMM15[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[10] - (0xff < sVar7);
                sVar7 = auVar105._12_2_;
                in_XMM15[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[0xc] - (0xff < sVar7);
                sVar7 = auVar105._14_2_;
                in_XMM15[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar105[0xe] - (0xff < sVar7);
                sVar7 = in_XMM10._0_2_;
                in_XMM15[8] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[0] - (0xff < sVar7);
                sVar7 = in_XMM10._2_2_;
                in_XMM15[9] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[2] - (0xff < sVar7);
                sVar7 = in_XMM10._4_2_;
                in_XMM15[10] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[4] - (0xff < sVar7);
                sVar7 = in_XMM10._6_2_;
                in_XMM15[0xb] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[6] - (0xff < sVar7);
                sVar7 = in_XMM10._8_2_;
                in_XMM15[0xc] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[8] - (0xff < sVar7);
                sVar7 = in_XMM10._10_2_;
                in_XMM15[0xd] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[10] - (0xff < sVar7);
                sVar7 = in_XMM10._12_2_;
                in_XMM15[0xe] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[0xc] - (0xff < sVar7);
                sVar7 = in_XMM10._14_2_;
                in_XMM15[0xf] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM10[0xe] - (0xff < sVar7);
                auVar45._0_2_ = auVar73._0_2_ * sVar78 + sVar90;
                auVar45._2_2_ = auVar73._2_2_ * sVar82 + sVar94;
                auVar45._4_2_ = auVar73._4_2_ * sVar83 + sVar95;
                auVar45._6_2_ = auVar73._6_2_ * sVar84 + sVar97;
                auVar45._8_2_ = auVar73._8_2_ * sVar85 + sVar98;
                auVar45._10_2_ = auVar73._10_2_ * sVar86 + sVar99;
                auVar45._12_2_ = auVar73._12_2_ * sVar87 + sVar100;
                auVar45._14_2_ = auVar73._14_2_ * sVar88 + sVar102;
                auVar105 = pmulhuw(auVar45,auVar10);
                sVar78 = auVar105._0_2_;
                sVar82 = auVar105._2_2_;
                in_XMM2[1] = (0 < sVar82) * (sVar82 < 0x100) * auVar105[2] - (0xff < sVar82);
                in_XMM2[0] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[0] - (0xff < sVar78);
                sVar78 = auVar105._4_2_;
                in_XMM2[2] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[4] - (0xff < sVar78);
                sVar78 = auVar105._6_2_;
                in_XMM2[3] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[6] - (0xff < sVar78);
                sVar78 = auVar105._8_2_;
                in_XMM2[4] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[8] - (0xff < sVar78);
                sVar78 = auVar105._10_2_;
                in_XMM2[5] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[10] - (0xff < sVar78);
                sVar78 = auVar105._12_2_;
                in_XMM2[6] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[0xc] - (0xff < sVar78);
                sVar78 = auVar105._14_2_;
                in_XMM2[7] = (0 < sVar78) * (sVar78 < 0x100) * auVar105[0xe] - (0xff < sVar78);
                sVar78 = auVar92._0_2_;
                in_XMM2[8] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0] - (0xff < sVar78);
                sVar78 = auVar92._2_2_;
                in_XMM2[9] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[2] - (0xff < sVar78);
                sVar78 = auVar92._4_2_;
                in_XMM2[10] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[4] - (0xff < sVar78);
                sVar78 = auVar92._6_2_;
                in_XMM2[0xb] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[6] - (0xff < sVar78);
                sVar78 = auVar92._8_2_;
                in_XMM2[0xc] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[8] - (0xff < sVar78);
                sVar78 = auVar92._10_2_;
                in_XMM2[0xd] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[10] - (0xff < sVar78);
                sVar78 = auVar92._12_2_;
                in_XMM2[0xe] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0xc] - (0xff < sVar78);
                sVar78 = auVar92._14_2_;
                in_XMM2[0xf] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0xe] - (0xff < sVar78);
                *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = in_XMM15;
                *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4) = in_XMM2;
                uVar16 = uVar16 + 8;
                uVar13 = uVar13 - 2;
              }
              if (uVar13 != 0) {
                auVar105 = *(undefined1 (*) [16])(lVar30 + uVar16 * 4);
                auVar92 = pmovzxbw(in_XMM10,auVar105);
                auVar52._0_2_ = (ushort)auVar105[8] * sVar78 + sVar90;
                auVar52._2_2_ = (ushort)auVar105[9] * sVar82 + sVar94;
                auVar52._4_2_ = (ushort)auVar105[10] * sVar83 + sVar95;
                auVar52._6_2_ = (ushort)auVar105[0xb] * sVar84 + sVar97;
                auVar52._8_2_ = (ushort)auVar105[0xc] * sVar85 + sVar98;
                auVar52._10_2_ = (ushort)auVar105[0xd] * sVar86 + sVar99;
                auVar52._12_2_ = (ushort)auVar105[0xe] * sVar87 + sVar100;
                auVar52._14_2_ = (ushort)auVar105[0xf] * sVar88 + sVar102;
                in_XMM2 = pmulhuw(auVar52,auVar10);
                auVar77._0_2_ = auVar92._0_2_ * sVar78 + sVar90;
                auVar77._2_2_ = auVar92._2_2_ * sVar82 + sVar94;
                auVar77._4_2_ = auVar92._4_2_ * sVar83 + sVar95;
                auVar77._6_2_ = auVar92._6_2_ * sVar84 + sVar97;
                auVar77._8_2_ = auVar92._8_2_ * sVar85 + sVar98;
                auVar77._10_2_ = auVar92._10_2_ * sVar86 + sVar99;
                auVar77._12_2_ = auVar92._12_2_ * sVar87 + sVar100;
                auVar77._14_2_ = auVar92._14_2_ * sVar88 + sVar102;
                auVar105 = pmulhuw(auVar77,auVar10);
                sVar90 = auVar105._0_2_;
                sVar94 = auVar105._2_2_;
                in_XMM10[1] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[2] - (0xff < sVar94);
                in_XMM10[0] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] - (0xff < sVar90);
                sVar90 = auVar105._4_2_;
                in_XMM10[2] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[4] - (0xff < sVar90);
                sVar90 = auVar105._6_2_;
                in_XMM10[3] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[6] - (0xff < sVar90);
                sVar90 = auVar105._8_2_;
                in_XMM10[4] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[8] - (0xff < sVar90);
                sVar90 = auVar105._10_2_;
                in_XMM10[5] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[10] - (0xff < sVar90);
                sVar90 = auVar105._12_2_;
                in_XMM10[6] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0xc] - (0xff < sVar90);
                sVar90 = auVar105._14_2_;
                in_XMM10[7] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0xe] - (0xff < sVar90);
                sVar90 = in_XMM2._0_2_;
                in_XMM10[8] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0] - (0xff < sVar90);
                sVar90 = in_XMM2._2_2_;
                in_XMM10[9] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[2] - (0xff < sVar90);
                sVar90 = in_XMM2._4_2_;
                in_XMM10[10] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[4] - (0xff < sVar90);
                sVar90 = in_XMM2._6_2_;
                in_XMM10[0xb] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[6] - (0xff < sVar90);
                sVar90 = in_XMM2._8_2_;
                in_XMM10[0xc] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[8] - (0xff < sVar90);
                sVar90 = in_XMM2._10_2_;
                in_XMM10[0xd] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[10] - (0xff < sVar90);
                sVar90 = in_XMM2._12_2_;
                in_XMM10[0xe] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0xc] - (0xff < sVar90);
                sVar90 = in_XMM2._14_2_;
                in_XMM10[0xf] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0xe] - (0xff < sVar90);
                *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = in_XMM10;
                uVar16 = uVar16 + 4;
              }
              for (; uVar16 < uVar20; uVar16 = uVar16 + 1) {
                auVar105 = ZEXT416(*(uint *)(lVar30 + uVar16 * 4));
                auVar105 = pmovzxbw(auVar105,auVar105);
                auVar53._0_2_ = auVar105._0_2_ * sVar78 + sVar89 * sVar33 + sVar61;
                auVar53._2_2_ = auVar105._2_2_ * sVar82 + sVar58 * sVar35 + sVar63;
                auVar53._4_2_ = auVar105._4_2_ * sVar83 + sVar89 * sVar36 + sVar64;
                auVar53._6_2_ = auVar105._6_2_ * sVar84 + sVar58 * sVar37 + sVar65;
                auVar53._8_2_ = auVar105._8_2_ * sVar85 + sVar89 * sVar38 + sVar66;
                auVar53._10_2_ = auVar105._10_2_ * sVar86 + sVar58 * sVar39 + sVar67;
                auVar53._12_2_ = auVar105._12_2_ * sVar87 + sVar89 * sVar40 + sVar68;
                auVar53._14_2_ = auVar105._14_2_ * sVar88 + sVar58 * sVar41 + sVar69;
                auVar105 = pmulhuw(auVar53,auVar11);
                sVar90 = auVar105._0_2_;
                sVar94 = auVar105._2_2_;
                sVar95 = auVar105._4_2_;
                sVar97 = auVar105._6_2_;
                in_XMM2._0_4_ =
                     CONCAT13((0 < sVar97) * (sVar97 < 0x100) * auVar105[6] - (0xff < sVar97),
                              CONCAT12((0 < sVar95) * (sVar95 < 0x100) * auVar105[4] -
                                       (0xff < sVar95),
                                       CONCAT11((0 < sVar94) * (sVar94 < 0x100) * auVar105[2] -
                                                (0xff < sVar94),
                                                (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] -
                                                (0xff < sVar90))));
                sVar98 = auVar105._8_2_;
                in_XMM2[4] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[8] - (0xff < sVar98);
                sVar99 = auVar105._10_2_;
                in_XMM2[5] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[10] - (0xff < sVar99);
                sVar100 = auVar105._12_2_;
                in_XMM2[6] = (0 < sVar100) * (sVar100 < 0x100) * auVar105[0xc] - (0xff < sVar100);
                sVar102 = auVar105._14_2_;
                in_XMM2[7] = (0 < sVar102) * (sVar102 < 0x100) * auVar105[0xe] - (0xff < sVar102);
                in_XMM2[8] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] - (0xff < sVar90);
                in_XMM2[9] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[2] - (0xff < sVar94);
                in_XMM2[10] = (0 < sVar95) * (sVar95 < 0x100) * auVar105[4] - (0xff < sVar95);
                in_XMM2[0xb] = (0 < sVar97) * (sVar97 < 0x100) * auVar105[6] - (0xff < sVar97);
                in_XMM2[0xc] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[8] - (0xff < sVar98);
                in_XMM2[0xd] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[10] - (0xff < sVar99);
                in_XMM2[0xe] = (0 < sVar100) * (sVar100 < 0x100) * auVar105[0xc] - (0xff < sVar100);
                in_XMM2[0xf] = (0 < sVar102) * (sVar102 < 0x100) * auVar105[0xe] - (0xff < sVar102);
                *(undefined4 *)(lVar30 + uVar16 * 4) = in_XMM2._0_4_;
              }
            }
          }
        }
        if (uVar22 == uVar28) {
          uVar16 = (long)*(int *)(this + 0x30);
          if (uVar25 < (ulong)(long)*(int *)(this + 0x30)) {
            uVar16 = uVar25;
          }
          uVar22 = 0;
        }
        else {
          uVar28 = uVar28 ^ uVar22;
          lVar6 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar22 = -1L << ((byte)lVar6 & 0x3f) ^ uVar28;
          uVar16 = (uint)((int)lVar6 << 2) | uVar15;
        }
        auVar80 = ZEXT416(uVar26);
        if (3 < uVar16 - uVar21) {
          uVar20 = uVar16 - uVar21 >> 2;
          auVar80._4_4_ = uVar26;
          auVar80._0_4_ = uVar26;
          auVar80._8_4_ = uVar26;
          auVar80._12_4_ = uVar26;
          while (bVar31 = uVar20 != 0, uVar20 = uVar20 - 1, bVar31) {
            piVar1 = (int *)(lVar29 + uVar21 * 8);
            iVar42 = *piVar1;
            piVar3 = (int *)(lVar29 + 0x10 + uVar21 * 8);
            iVar96 = iVar42 + piVar1[2];
            auVar9._4_4_ = iVar96;
            auVar9._0_4_ = iVar42;
            auVar9._8_8_ = 0;
            iVar56 = auVar80._0_4_;
            iVar59 = auVar80._4_4_;
            iVar60 = auVar80._8_4_;
            iVar101 = *piVar3 + piVar3[2] + auVar80._12_4_ + iVar96;
            auVar80._4_4_ = iVar101;
            auVar80._0_4_ = iVar101;
            auVar80._8_4_ = iVar101;
            auVar80._12_4_ = iVar101;
            auVar91._0_4_ = (iVar42 + iVar56) - ((uint)piVar1[1] >> 9);
            auVar91._4_4_ = (iVar96 + iVar59) - ((uint)piVar1[3] >> 9);
            auVar91._8_4_ = (piVar1[2] + *piVar3 + iVar60 + iVar42) - ((uint)piVar3[1] >> 9);
            auVar91._12_4_ = iVar101 - ((uint)piVar3[3] >> 9);
            auVar92 = packusdw(auVar91 & auVar70,auVar91 & auVar70);
            iVar42 = 0x1ff01ff - auVar92._0_4_;
            iVar56 = 0x1ff01ff - auVar92._4_4_;
            iVar59 = 0x1ff01ff - auVar92._8_4_;
            iVar60 = 0x1ff01ff - auVar92._12_4_;
            sVar89 = auVar92._0_2_;
            sVar94 = (short)iVar42;
            sVar58 = auVar92._2_2_;
            sVar95 = (short)((uint)iVar42 >> 0x10);
            sVar90 = auVar92._4_2_;
            sVar97 = (short)iVar56;
            uVar55 = (ushort)(sVar90 < sVar97) * sVar90 | (ushort)(sVar90 >= sVar97) * sVar97;
            sVar90 = auVar92._6_2_;
            sVar97 = (short)((uint)iVar56 >> 0x10);
            uVar57 = (ushort)(sVar90 < sVar97) * sVar90 | (ushort)(sVar90 >= sVar97) * sVar97;
            auVar47._0_8_ =
                 CONCAT26(uVar57,CONCAT24(uVar55,CONCAT22((ushort)(sVar58 < sVar95) * sVar58 |
                                                          (ushort)(sVar58 >= sVar95) * sVar95,
                                                          (ushort)(sVar89 < sVar94) * sVar89 |
                                                          (ushort)(sVar89 >= sVar94) * sVar94)));
            sVar89 = auVar92._8_2_;
            sVar58 = (short)iVar59;
            auVar44._0_10_ =
                 CONCAT28((ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58,
                          auVar47._0_8_);
            sVar89 = auVar92._10_2_;
            sVar58 = (short)((uint)iVar59 >> 0x10);
            auVar44._10_2_ =
                 (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
            sVar89 = auVar92._12_2_;
            sVar58 = (short)iVar60;
            sVar90 = (short)((uint)iVar60 >> 0x10);
            auVar46._12_2_ =
                 (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
            auVar46._0_12_ = auVar44;
            sVar89 = auVar92._14_2_;
            auVar46._14_2_ =
                 (ushort)(sVar89 < sVar90) * sVar89 | (ushort)(sVar89 >= sVar90) * sVar90;
            auVar73 = pshuflw(auVar9 << 0x40,auVar46,0x50);
            auVar49._12_2_ = uVar57;
            auVar49._0_12_ = auVar44;
            auVar49._14_2_ = uVar57;
            auVar48._12_4_ = auVar49._12_4_;
            auVar48._10_2_ = uVar55;
            auVar48._0_10_ = auVar44._0_10_;
            auVar47._10_6_ = auVar48._10_6_;
            auVar47._8_2_ = uVar55;
            *(undefined1 (*) [16])(lVar29 + uVar21 * 8) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(lVar29 + 0x10 + uVar21 * 8) = (undefined1  [16])0x0;
            auVar105 = *(undefined1 (*) [16])(lVar30 + uVar21 * 4);
            auVar93 = pmovzxbw(auVar92,auVar105);
            auVar74._0_4_ = auVar73._0_4_;
            auVar74._4_4_ = auVar74._0_4_;
            auVar74._8_4_ = auVar73._4_4_;
            auVar74._12_4_ = auVar73._4_4_;
            auVar50._4_4_ = auVar47._8_4_;
            auVar50._0_4_ = auVar47._8_4_;
            auVar50._8_4_ = auVar48._12_4_;
            auVar50._12_4_ = auVar48._12_4_;
            auVar92 = pmovzxbw(in_XMM3,0xffffffffffffffff);
            auVar74 = auVar74 ^ auVar92;
            in_XMM10._0_2_ = auVar74._0_2_ * auVar93._0_2_;
            in_XMM10._2_2_ = auVar74._2_2_ * auVar93._2_2_;
            in_XMM10._4_2_ = auVar74._4_2_ * auVar93._4_2_;
            in_XMM10._6_2_ = auVar74._6_2_ * auVar93._6_2_;
            in_XMM10._8_2_ = auVar74._8_2_ * auVar93._8_2_;
            in_XMM10._10_2_ = auVar74._10_2_ * auVar93._10_2_;
            in_XMM10._12_2_ = auVar74._12_2_ * auVar93._12_2_;
            in_XMM10._14_2_ = auVar74._14_2_ * auVar93._14_2_;
            auVar50 = auVar50 ^ auVar92;
            in_XMM2._0_2_ = auVar50._0_2_ * (ushort)auVar105[8];
            in_XMM2._2_2_ = auVar50._2_2_ * (ushort)auVar105[9];
            in_XMM2._4_2_ = auVar50._4_2_ * (ushort)auVar105[10];
            in_XMM2._6_2_ = auVar50._6_2_ * (ushort)auVar105[0xb];
            in_XMM2._8_2_ = auVar50._8_2_ * (ushort)auVar105[0xc];
            in_XMM2._10_2_ = auVar50._10_2_ * (ushort)auVar105[0xd];
            in_XMM2._12_2_ = auVar50._12_2_ * (ushort)auVar105[0xe];
            in_XMM2._14_2_ = auVar50._14_2_ * (ushort)auVar105[0xf];
            in_XMM3 = pmovzxbw(auVar92,0x8080808080808080);
            auVar104._0_2_ = auVar73._0_2_ * sVar33 + in_XMM3._0_2_ + in_XMM10._0_2_;
            auVar104._2_2_ = auVar73._2_2_ * sVar35 + in_XMM3._2_2_ + in_XMM10._2_2_;
            auVar104._4_2_ = auVar73._0_2_ * sVar36 + in_XMM3._4_2_ + in_XMM10._4_2_;
            auVar104._6_2_ = auVar73._2_2_ * sVar37 + in_XMM3._6_2_ + in_XMM10._6_2_;
            auVar104._8_2_ = auVar73._4_2_ * sVar38 + in_XMM3._8_2_ + in_XMM10._8_2_;
            auVar104._10_2_ = auVar73._6_2_ * sVar39 + in_XMM3._10_2_ + in_XMM10._10_2_;
            auVar104._12_2_ = auVar73._4_2_ * sVar40 + in_XMM3._12_2_ + in_XMM10._12_2_;
            auVar104._14_2_ = auVar73._6_2_ * sVar41 + in_XMM3._14_2_ + in_XMM10._14_2_;
            auVar105 = pmulhuw(auVar104,auVar10);
            auVar108._0_2_ = uVar55 * sVar33 + in_XMM3._0_2_ + in_XMM2._0_2_;
            auVar108._2_2_ = uVar55 * sVar35 + in_XMM3._2_2_ + in_XMM2._2_2_;
            auVar108._4_2_ = uVar55 * sVar36 + in_XMM3._4_2_ + in_XMM2._4_2_;
            auVar108._6_2_ = uVar55 * sVar37 + in_XMM3._6_2_ + in_XMM2._6_2_;
            auVar108._8_2_ = uVar57 * sVar38 + in_XMM3._8_2_ + in_XMM2._8_2_;
            auVar108._10_2_ = uVar57 * sVar39 + in_XMM3._10_2_ + in_XMM2._10_2_;
            auVar108._12_2_ = uVar57 * sVar40 + in_XMM3._12_2_ + in_XMM2._12_2_;
            auVar108._14_2_ = uVar57 * sVar41 + in_XMM3._14_2_ + in_XMM2._14_2_;
            in_XMM15 = pmulhuw(auVar108,auVar10);
            sVar89 = auVar105._0_2_;
            sVar58 = auVar105._2_2_;
            sVar90 = auVar105._4_2_;
            sVar94 = auVar105._6_2_;
            sVar95 = auVar105._8_2_;
            sVar97 = auVar105._10_2_;
            sVar98 = auVar105._12_2_;
            sVar99 = auVar105._14_2_;
            sVar100 = in_XMM15._0_2_;
            sVar102 = in_XMM15._2_2_;
            sVar78 = in_XMM15._4_2_;
            sVar82 = in_XMM15._6_2_;
            sVar83 = in_XMM15._8_2_;
            sVar84 = in_XMM15._10_2_;
            sVar85 = in_XMM15._12_2_;
            sVar86 = in_XMM15._14_2_;
            pcVar2 = (char *)(lVar30 + uVar21 * 4);
            *pcVar2 = (0 < sVar89) * (sVar89 < 0x100) * auVar105[0] - (0xff < sVar89);
            pcVar2[1] = (0 < sVar58) * (sVar58 < 0x100) * auVar105[2] - (0xff < sVar58);
            pcVar2[2] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[4] - (0xff < sVar90);
            pcVar2[3] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[6] - (0xff < sVar94);
            pcVar2[4] = (0 < sVar95) * (sVar95 < 0x100) * auVar105[8] - (0xff < sVar95);
            pcVar2[5] = (0 < sVar97) * (sVar97 < 0x100) * auVar105[10] - (0xff < sVar97);
            pcVar2[6] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[0xc] - (0xff < sVar98);
            pcVar2[7] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[0xe] - (0xff < sVar99);
            pcVar2[8] = (0 < sVar100) * (sVar100 < 0x100) * in_XMM15[0] - (0xff < sVar100);
            pcVar2[9] = (0 < sVar102) * (sVar102 < 0x100) * in_XMM15[2] - (0xff < sVar102);
            pcVar2[10] = (0 < sVar78) * (sVar78 < 0x100) * in_XMM15[4] - (0xff < sVar78);
            pcVar2[0xb] = (0 < sVar82) * (sVar82 < 0x100) * in_XMM15[6] - (0xff < sVar82);
            pcVar2[0xc] = (0 < sVar83) * (sVar83 < 0x100) * in_XMM15[8] - (0xff < sVar83);
            pcVar2[0xd] = (0 < sVar84) * (sVar84 < 0x100) * in_XMM15[10] - (0xff < sVar84);
            pcVar2[0xe] = (0 < sVar85) * (sVar85 < 0x100) * in_XMM15[0xc] - (0xff < sVar85);
            pcVar2[0xf] = (0 < sVar86) * (sVar86 < 0x100) * in_XMM15[0xe] - (0xff < sVar86);
            uVar21 = uVar21 + 4;
          }
        }
        for (; uVar26 = auVar80._0_4_, uVar21 < uVar16; uVar21 = uVar21 + 1) {
          auVar81._0_4_ = uVar26 + *(int *)(lVar29 + uVar21 * 8);
          auVar81._4_4_ = auVar80._4_4_;
          auVar81._8_4_ = auVar80._8_4_;
          auVar81._12_4_ = auVar80._12_4_;
          *(undefined8 *)(lVar29 + uVar21 * 8) = 0;
          auVar51._0_4_ = auVar81._0_4_ - (*(uint *)(lVar29 + 4 + uVar21 * 8) >> 9);
          auVar51._4_4_ = auVar81._4_4_;
          auVar51._8_4_ = auVar81._8_4_;
          auVar51._12_4_ = auVar81._12_4_;
          auVar105 = packusdw(auVar51 & auVar70,auVar51 & auVar70);
          iVar42 = auVar70._0_4_ - auVar105._0_4_;
          iVar56 = auVar70._4_4_ - auVar105._4_4_;
          iVar59 = auVar70._8_4_ - auVar105._8_4_;
          iVar60 = auVar70._12_4_ - auVar105._12_4_;
          sVar89 = auVar105._0_2_;
          sVar58 = (short)iVar42;
          auVar75._0_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._2_2_;
          sVar58 = (short)((uint)iVar42 >> 0x10);
          auVar75._2_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._4_2_;
          sVar58 = (short)iVar56;
          auVar75._4_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._6_2_;
          sVar58 = (short)((uint)iVar56 >> 0x10);
          auVar75._6_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._8_2_;
          sVar58 = (short)iVar59;
          auVar75._8_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._10_2_;
          sVar58 = (short)((uint)iVar59 >> 0x10);
          auVar75._10_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._12_2_;
          sVar58 = (short)iVar60;
          sVar90 = (short)((uint)iVar60 >> 0x10);
          auVar75._12_2_ = (ushort)(sVar89 < sVar58) * sVar89 | (ushort)(sVar89 >= sVar58) * sVar58;
          sVar89 = auVar105._14_2_;
          auVar75._14_2_ = (ushort)(sVar89 < sVar90) * sVar89 | (ushort)(sVar89 >= sVar90) * sVar90;
          auVar105 = ZEXT416(*(uint *)(lVar30 + uVar21 * 4));
          auVar92 = pshuflw(auVar75,auVar75,0);
          in_XMM2 = pmovzxbw(auVar105,auVar105);
          auVar105 = auVar92 ^ auVar71;
          auVar76._0_2_ = auVar105._0_2_ * in_XMM2._0_2_ + auVar92._0_2_ * sVar33 + sVar61;
          auVar76._2_2_ = auVar105._2_2_ * in_XMM2._2_2_ + auVar92._2_2_ * sVar35 + sVar63;
          auVar76._4_2_ = auVar105._4_2_ * in_XMM2._4_2_ + auVar92._4_2_ * sVar36 + sVar64;
          auVar76._6_2_ = auVar105._6_2_ * in_XMM2._6_2_ + auVar92._6_2_ * sVar37 + sVar65;
          auVar76._8_2_ = auVar105._8_2_ * in_XMM2._8_2_ + auVar92._8_2_ * sVar38 + sVar66;
          auVar76._10_2_ = auVar105._10_2_ * in_XMM2._10_2_ + auVar92._10_2_ * sVar39 + sVar67;
          auVar76._12_2_ = auVar105._12_2_ * in_XMM2._12_2_ + auVar92._12_2_ * sVar40 + sVar68;
          auVar76._14_2_ = auVar105._14_2_ * in_XMM2._14_2_ + auVar92._14_2_ * sVar41 + sVar69;
          auVar105 = pmulhuw(auVar76,auVar11);
          sVar89 = auVar105._0_2_;
          sVar58 = auVar105._2_2_;
          sVar90 = auVar105._4_2_;
          sVar94 = auVar105._6_2_;
          in_XMM10._0_4_ =
               CONCAT13((0 < sVar94) * (sVar94 < 0x100) * auVar105[6] - (0xff < sVar94),
                        CONCAT12((0 < sVar90) * (sVar90 < 0x100) * auVar105[4] - (0xff < sVar90),
                                 CONCAT11((0 < sVar58) * (sVar58 < 0x100) * auVar105[2] -
                                          (0xff < sVar58),
                                          (0 < sVar89) * (sVar89 < 0x100) * auVar105[0] -
                                          (0xff < sVar89))));
          sVar95 = auVar105._8_2_;
          in_XMM10[4] = (0 < sVar95) * (sVar95 < 0x100) * auVar105[8] - (0xff < sVar95);
          sVar97 = auVar105._10_2_;
          in_XMM10[5] = (0 < sVar97) * (sVar97 < 0x100) * auVar105[10] - (0xff < sVar97);
          sVar98 = auVar105._12_2_;
          in_XMM10[6] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[0xc] - (0xff < sVar98);
          sVar99 = auVar105._14_2_;
          in_XMM10[7] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[0xe] - (0xff < sVar99);
          in_XMM10[8] = (0 < sVar89) * (sVar89 < 0x100) * auVar105[0] - (0xff < sVar89);
          in_XMM10[9] = (0 < sVar58) * (sVar58 < 0x100) * auVar105[2] - (0xff < sVar58);
          in_XMM10[10] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[4] - (0xff < sVar90);
          in_XMM10[0xb] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[6] - (0xff < sVar94);
          in_XMM10[0xc] = (0 < sVar95) * (sVar95 < 0x100) * auVar105[8] - (0xff < sVar95);
          in_XMM10[0xd] = (0 < sVar97) * (sVar97 < 0x100) * auVar105[10] - (0xff < sVar97);
          in_XMM10[0xe] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[0xc] - (0xff < sVar98);
          in_XMM10[0xf] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[0xe] - (0xff < sVar99);
          *(undefined4 *)(lVar30 + uVar21 * 4) = in_XMM10._0_4_;
          auVar80 = auVar81;
        }
      }
      puVar27 = puVar27 + 1;
      lVar14 = lVar14 + -1;
      uVar15 = uVar25;
    } while (lVar14 != 0);
    uVar15 = (ulong)*(int *)(this + 0x30);
    uVar25 = uVar15 - uVar16;
    if (uVar16 <= uVar15 && uVar25 != 0) {
      uVar26 = uVar26 & 0x1ff;
      uVar24 = uVar26 ^ 0x1ff;
      if (uVar26 < 0x100) {
        uVar24 = uVar26;
      }
      if (uVar24 != 0) {
        uVar22 = uVar25 >> 2;
        if (uVar24 == 0xff) {
          puVar23 = (uint32_t *)(lVar30 + uVar16 * 4);
          for (uVar21 = uVar22; 7 < uVar21; uVar21 = uVar21 - 8) {
            *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x20 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x30 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x40 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x50 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x60 + uVar16 * 4) = auVar32;
            *(undefined1 (*) [16])(lVar30 + 0x70 + uVar16 * 4) = auVar32;
            uVar16 = uVar16 + 0x20;
            puVar23 = puVar23 + 0x20;
          }
          lVar14 = uVar22 - (uVar25 >> 2 & 0x3ffffffffffffff8);
          while (bVar31 = lVar14 != 0, lVar14 = lVar14 + -1, bVar31) {
            *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = auVar32;
            uVar16 = uVar16 + 4;
            puVar23 = puVar23 + 4;
          }
          for (; uVar16 < uVar15; uVar16 = uVar16 + 1) {
            *puVar23 = uVar12;
            puVar23 = puVar23 + 1;
          }
        }
        else {
          in_XMM2 = pshuflw(ZEXT416(uVar24),ZEXT416(uVar24),0);
          uVar43 = in_XMM2._0_4_;
          auVar105._4_4_ = uVar43;
          auVar105._0_4_ = uVar43;
          auVar105._8_4_ = uVar43;
          auVar105._12_4_ = uVar43;
          sVar89 = in_XMM2._0_2_;
          sVar58 = in_XMM2._2_2_;
          auVar105 = auVar105 ^ _DAT_00118170;
          sVar90 = sVar89 * sVar33 + 0x80;
          sVar94 = sVar58 * sVar35 + 0x80;
          sVar95 = sVar89 * sVar36 + 0x80;
          sVar97 = sVar58 * sVar37 + 0x80;
          sVar98 = sVar89 * sVar38 + 0x80;
          sVar99 = sVar58 * sVar39 + 0x80;
          sVar100 = sVar89 * sVar40 + 0x80;
          sVar102 = sVar58 * sVar41 + 0x80;
          uVar21 = uVar22;
          while( true ) {
            sVar78 = auVar105._0_2_;
            sVar82 = auVar105._2_2_;
            sVar83 = auVar105._4_2_;
            sVar84 = auVar105._6_2_;
            sVar85 = auVar105._8_2_;
            sVar86 = auVar105._10_2_;
            sVar87 = auVar105._12_2_;
            sVar88 = auVar105._14_2_;
            if (uVar21 < 2) break;
            auVar92 = *(undefined1 (*) [16])(lVar30 + uVar16 * 4);
            auVar73 = *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4);
            auVar109 = pmovzxbw(in_XMM15,auVar92);
            auVar93 = pmovzxbw(in_XMM10,auVar73);
            auVar54._0_2_ = (ushort)auVar92[8] * sVar78 + sVar90;
            auVar54._2_2_ = (ushort)auVar92[9] * sVar82 + sVar94;
            auVar54._4_2_ = (ushort)auVar92[10] * sVar83 + sVar95;
            auVar54._6_2_ = (ushort)auVar92[0xb] * sVar84 + sVar97;
            auVar54._8_2_ = (ushort)auVar92[0xc] * sVar85 + sVar98;
            auVar54._10_2_ = (ushort)auVar92[0xd] * sVar86 + sVar99;
            auVar54._12_2_ = (ushort)auVar92[0xe] * sVar87 + sVar100;
            auVar54._14_2_ = (ushort)auVar92[0xf] * sVar88 + sVar102;
            in_XMM2 = pmulhuw(auVar54,auVar10);
            auVar106._0_2_ = (ushort)auVar73[8] * sVar78 + sVar90;
            auVar106._2_2_ = (ushort)auVar73[9] * sVar82 + sVar94;
            auVar106._4_2_ = (ushort)auVar73[10] * sVar83 + sVar95;
            auVar106._6_2_ = (ushort)auVar73[0xb] * sVar84 + sVar97;
            auVar106._8_2_ = (ushort)auVar73[0xc] * sVar85 + sVar98;
            auVar106._10_2_ = (ushort)auVar73[0xd] * sVar86 + sVar99;
            auVar106._12_2_ = (ushort)auVar73[0xe] * sVar87 + sVar100;
            auVar106._14_2_ = (ushort)auVar73[0xf] * sVar88 + sVar102;
            auVar73 = pmulhuw(auVar106,auVar10);
            auVar110._0_2_ = auVar109._0_2_ * sVar78 + sVar90;
            auVar110._2_2_ = auVar109._2_2_ * sVar82 + sVar94;
            auVar110._4_2_ = auVar109._4_2_ * sVar83 + sVar95;
            auVar110._6_2_ = auVar109._6_2_ * sVar84 + sVar97;
            auVar110._8_2_ = auVar109._8_2_ * sVar85 + sVar98;
            auVar110._10_2_ = auVar109._10_2_ * sVar86 + sVar99;
            auVar110._12_2_ = auVar109._12_2_ * sVar87 + sVar100;
            auVar110._14_2_ = auVar109._14_2_ * sVar88 + sVar102;
            auVar92 = pmulhuw(auVar110,auVar10);
            sVar7 = auVar92._0_2_;
            sVar8 = auVar92._2_2_;
            in_XMM15[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar92[2] - (0xff < sVar8);
            in_XMM15[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[0] - (0xff < sVar7);
            sVar7 = auVar92._4_2_;
            in_XMM15[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[4] - (0xff < sVar7);
            sVar7 = auVar92._6_2_;
            in_XMM15[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[6] - (0xff < sVar7);
            sVar7 = auVar92._8_2_;
            in_XMM15[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[8] - (0xff < sVar7);
            sVar7 = auVar92._10_2_;
            in_XMM15[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[10] - (0xff < sVar7);
            sVar7 = auVar92._12_2_;
            in_XMM15[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[0xc] - (0xff < sVar7);
            sVar7 = auVar92._14_2_;
            in_XMM15[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar92[0xe] - (0xff < sVar7);
            sVar7 = in_XMM2._0_2_;
            in_XMM15[8] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[0] - (0xff < sVar7);
            sVar7 = in_XMM2._2_2_;
            in_XMM15[9] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[2] - (0xff < sVar7);
            sVar7 = in_XMM2._4_2_;
            in_XMM15[10] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[4] - (0xff < sVar7);
            sVar7 = in_XMM2._6_2_;
            in_XMM15[0xb] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[6] - (0xff < sVar7);
            sVar7 = in_XMM2._8_2_;
            in_XMM15[0xc] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[8] - (0xff < sVar7);
            sVar7 = in_XMM2._10_2_;
            in_XMM15[0xd] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[10] - (0xff < sVar7);
            sVar7 = in_XMM2._12_2_;
            in_XMM15[0xe] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[0xc] - (0xff < sVar7);
            sVar7 = in_XMM2._14_2_;
            in_XMM15[0xf] = (0 < sVar7) * (sVar7 < 0x100) * in_XMM2[0xe] - (0xff < sVar7);
            auVar109._0_2_ = auVar93._0_2_ * sVar78 + sVar90;
            auVar109._2_2_ = auVar93._2_2_ * sVar82 + sVar94;
            auVar109._4_2_ = auVar93._4_2_ * sVar83 + sVar95;
            auVar109._6_2_ = auVar93._6_2_ * sVar84 + sVar97;
            auVar109._8_2_ = auVar93._8_2_ * sVar85 + sVar98;
            auVar109._10_2_ = auVar93._10_2_ * sVar86 + sVar99;
            auVar109._12_2_ = auVar93._12_2_ * sVar87 + sVar100;
            auVar109._14_2_ = auVar93._14_2_ * sVar88 + sVar102;
            auVar92 = pmulhuw(auVar109,auVar10);
            sVar78 = auVar92._0_2_;
            sVar82 = auVar92._2_2_;
            in_XMM10[1] = (0 < sVar82) * (sVar82 < 0x100) * auVar92[2] - (0xff < sVar82);
            in_XMM10[0] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0] - (0xff < sVar78);
            sVar78 = auVar92._4_2_;
            in_XMM10[2] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[4] - (0xff < sVar78);
            sVar78 = auVar92._6_2_;
            in_XMM10[3] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[6] - (0xff < sVar78);
            sVar78 = auVar92._8_2_;
            in_XMM10[4] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[8] - (0xff < sVar78);
            sVar78 = auVar92._10_2_;
            in_XMM10[5] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[10] - (0xff < sVar78);
            sVar78 = auVar92._12_2_;
            in_XMM10[6] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0xc] - (0xff < sVar78);
            sVar78 = auVar92._14_2_;
            in_XMM10[7] = (0 < sVar78) * (sVar78 < 0x100) * auVar92[0xe] - (0xff < sVar78);
            sVar78 = auVar73._0_2_;
            in_XMM10[8] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[0] - (0xff < sVar78);
            sVar78 = auVar73._2_2_;
            in_XMM10[9] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[2] - (0xff < sVar78);
            sVar78 = auVar73._4_2_;
            in_XMM10[10] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[4] - (0xff < sVar78);
            sVar78 = auVar73._6_2_;
            in_XMM10[0xb] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[6] - (0xff < sVar78);
            sVar78 = auVar73._8_2_;
            in_XMM10[0xc] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[8] - (0xff < sVar78);
            sVar78 = auVar73._10_2_;
            in_XMM10[0xd] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[10] - (0xff < sVar78);
            sVar78 = auVar73._12_2_;
            in_XMM10[0xe] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[0xc] - (0xff < sVar78);
            sVar78 = auVar73._14_2_;
            in_XMM10[0xf] = (0 < sVar78) * (sVar78 < 0x100) * auVar73[0xe] - (0xff < sVar78);
            *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = in_XMM15;
            *(undefined1 (*) [16])(lVar30 + 0x10 + uVar16 * 4) = in_XMM10;
            uVar16 = uVar16 + 8;
            uVar21 = uVar21 - 2;
          }
          if (uVar22 != (uVar25 >> 2 & 0x3ffffffffffffffe)) {
            auVar105 = *(undefined1 (*) [16])(lVar30 + uVar16 * 4);
            auVar73 = pmovzxbw(in_XMM10,auVar105);
            auVar92._0_2_ = (ushort)auVar105[8] * sVar78 + sVar90;
            auVar92._2_2_ = (ushort)auVar105[9] * sVar82 + sVar94;
            auVar92._4_2_ = (ushort)auVar105[10] * sVar83 + sVar95;
            auVar92._6_2_ = (ushort)auVar105[0xb] * sVar84 + sVar97;
            auVar92._8_2_ = (ushort)auVar105[0xc] * sVar85 + sVar98;
            auVar92._10_2_ = (ushort)auVar105[0xd] * sVar86 + sVar99;
            auVar92._12_2_ = (ushort)auVar105[0xe] * sVar87 + sVar100;
            auVar92._14_2_ = (ushort)auVar105[0xf] * sVar88 + sVar102;
            in_XMM2 = pmulhuw(auVar92,auVar10);
            auVar93._0_2_ = auVar73._0_2_ * sVar78 + sVar90;
            auVar93._2_2_ = auVar73._2_2_ * sVar82 + sVar94;
            auVar93._4_2_ = auVar73._4_2_ * sVar83 + sVar95;
            auVar93._6_2_ = auVar73._6_2_ * sVar84 + sVar97;
            auVar93._8_2_ = auVar73._8_2_ * sVar85 + sVar98;
            auVar93._10_2_ = auVar73._10_2_ * sVar86 + sVar99;
            auVar93._12_2_ = auVar73._12_2_ * sVar87 + sVar100;
            auVar93._14_2_ = auVar73._14_2_ * sVar88 + sVar102;
            auVar105 = pmulhuw(auVar93,auVar10);
            sVar90 = auVar105._0_2_;
            sVar94 = auVar105._2_2_;
            in_XMM10[1] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[2] - (0xff < sVar94);
            in_XMM10[0] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] - (0xff < sVar90);
            sVar90 = auVar105._4_2_;
            in_XMM10[2] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[4] - (0xff < sVar90);
            sVar90 = auVar105._6_2_;
            in_XMM10[3] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[6] - (0xff < sVar90);
            sVar90 = auVar105._8_2_;
            in_XMM10[4] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[8] - (0xff < sVar90);
            sVar90 = auVar105._10_2_;
            in_XMM10[5] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[10] - (0xff < sVar90);
            sVar90 = auVar105._12_2_;
            in_XMM10[6] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0xc] - (0xff < sVar90);
            sVar90 = auVar105._14_2_;
            in_XMM10[7] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0xe] - (0xff < sVar90);
            sVar90 = in_XMM2._0_2_;
            in_XMM10[8] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0] - (0xff < sVar90);
            sVar90 = in_XMM2._2_2_;
            in_XMM10[9] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[2] - (0xff < sVar90);
            sVar90 = in_XMM2._4_2_;
            in_XMM10[10] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[4] - (0xff < sVar90);
            sVar90 = in_XMM2._6_2_;
            in_XMM10[0xb] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[6] - (0xff < sVar90);
            sVar90 = in_XMM2._8_2_;
            in_XMM10[0xc] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[8] - (0xff < sVar90);
            sVar90 = in_XMM2._10_2_;
            in_XMM10[0xd] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[10] - (0xff < sVar90);
            sVar90 = in_XMM2._12_2_;
            in_XMM10[0xe] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0xc] - (0xff < sVar90);
            sVar90 = in_XMM2._14_2_;
            in_XMM10[0xf] = (0 < sVar90) * (sVar90 < 0x100) * in_XMM2[0xe] - (0xff < sVar90);
            *(undefined1 (*) [16])(lVar30 + uVar16 * 4) = in_XMM10;
            uVar16 = uVar16 + 4;
          }
          for (; uVar16 < uVar15; uVar16 = uVar16 + 1) {
            auVar105 = ZEXT416(*(uint *)(lVar30 + uVar16 * 4));
            auVar105 = pmovzxbw(auVar105,auVar105);
            auVar73._0_2_ = auVar105._0_2_ * sVar78 + sVar89 * sVar33 + sVar61;
            auVar73._2_2_ = auVar105._2_2_ * sVar82 + sVar58 * sVar35 + sVar63;
            auVar73._4_2_ = auVar105._4_2_ * sVar83 + sVar89 * sVar36 + sVar64;
            auVar73._6_2_ = auVar105._6_2_ * sVar84 + sVar58 * sVar37 + sVar65;
            auVar73._8_2_ = auVar105._8_2_ * sVar85 + sVar89 * sVar38 + sVar66;
            auVar73._10_2_ = auVar105._10_2_ * sVar86 + sVar58 * sVar39 + sVar67;
            auVar73._12_2_ = auVar105._12_2_ * sVar87 + sVar89 * sVar40 + sVar68;
            auVar73._14_2_ = auVar105._14_2_ * sVar88 + sVar58 * sVar41 + sVar69;
            auVar105 = pmulhuw(auVar73,auVar11);
            sVar90 = auVar105._0_2_;
            sVar94 = auVar105._2_2_;
            sVar95 = auVar105._4_2_;
            sVar97 = auVar105._6_2_;
            in_XMM2._0_4_ =
                 CONCAT13((0 < sVar97) * (sVar97 < 0x100) * auVar105[6] - (0xff < sVar97),
                          CONCAT12((0 < sVar95) * (sVar95 < 0x100) * auVar105[4] - (0xff < sVar95),
                                   CONCAT11((0 < sVar94) * (sVar94 < 0x100) * auVar105[2] -
                                            (0xff < sVar94),
                                            (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] -
                                            (0xff < sVar90))));
            sVar98 = auVar105._8_2_;
            in_XMM2[4] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[8] - (0xff < sVar98);
            sVar99 = auVar105._10_2_;
            in_XMM2[5] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[10] - (0xff < sVar99);
            sVar100 = auVar105._12_2_;
            in_XMM2[6] = (0 < sVar100) * (sVar100 < 0x100) * auVar105[0xc] - (0xff < sVar100);
            sVar102 = auVar105._14_2_;
            in_XMM2[7] = (0 < sVar102) * (sVar102 < 0x100) * auVar105[0xe] - (0xff < sVar102);
            in_XMM2[8] = (0 < sVar90) * (sVar90 < 0x100) * auVar105[0] - (0xff < sVar90);
            in_XMM2[9] = (0 < sVar94) * (sVar94 < 0x100) * auVar105[2] - (0xff < sVar94);
            in_XMM2[10] = (0 < sVar95) * (sVar95 < 0x100) * auVar105[4] - (0xff < sVar95);
            in_XMM2[0xb] = (0 < sVar97) * (sVar97 < 0x100) * auVar105[6] - (0xff < sVar97);
            in_XMM2[0xc] = (0 < sVar98) * (sVar98 < 0x100) * auVar105[8] - (0xff < sVar98);
            in_XMM2[0xd] = (0 < sVar99) * (sVar99 < 0x100) * auVar105[10] - (0xff < sVar99);
            in_XMM2[0xe] = (0 < sVar100) * (sVar100 < 0x100) * auVar105[0xc] - (0xff < sVar100);
            in_XMM2[0xf] = (0 < sVar102) * (sVar102 < 0x100) * auVar105[0xe] - (0xff < sVar102);
            *(undefined4 *)(lVar30 + uVar16 * 4) = in_XMM2._0_4_;
          }
        }
      }
    }
    lVar30 = lVar30 + lVar5;
    lVar29 = lVar29 + *(long *)(this + 0x58) * 8;
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}